

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsPerCategory
          (BeagleCPUImpl<float,_1,_0> *this,int bufferIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outLogLikelihoodPerCategory)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  
  iVar10 = this->kCategoryCount;
  if (0 < iVar10) {
    lVar9 = 0;
    iVar6 = 0;
    pfVar2 = this->gPartials[bufferIndex];
    pfVar3 = this->gStateFrequencies[stateFrequenciesIndex];
    iVar7 = this->kPatternCount;
    iVar4 = 0;
    do {
      if (0 < iVar7) {
        lVar9 = (long)(int)lVar9;
        iVar10 = 0;
        do {
          iVar7 = this->kStateCount;
          if ((long)iVar7 < 1) {
            dVar11 = 0.0;
          }
          else {
            auVar12 = ZEXT816(0);
            lVar5 = 0;
            do {
              auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)pfVar2[iVar6 + lVar5]),
                                        ZEXT416((uint)pfVar3[lVar5]));
              lVar5 = lVar5 + 1;
            } while (iVar7 != lVar5);
            dVar11 = (double)auVar12._0_4_;
            iVar6 = iVar6 + iVar7;
          }
          dVar11 = log(dVar11);
          outLogLikelihoodPerCategory[lVar9] = dVar11;
          lVar9 = lVar9 + 1;
          iVar10 = iVar10 + 1;
          iVar7 = this->kPatternCount;
        } while (iVar10 < iVar7);
        iVar10 = this->kCategoryCount;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < iVar10);
  }
  if ((-1 < scalingFactorsIndex) && (0 < iVar10)) {
    iVar7 = 0;
    iVar4 = 0;
    pfVar2 = this->gScaleBuffers[(uint)scalingFactorsIndex];
    uVar1 = this->kPatternCount;
    do {
      if (0 < (int)uVar1) {
        uVar8 = 0;
        do {
          outLogLikelihoodPerCategory[(long)iVar4 + uVar8] =
               (double)pfVar2[uVar8] + outLogLikelihoodPerCategory[(long)iVar4 + uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar1 != uVar8);
        iVar4 = iVar4 + (int)uVar8;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar10);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsPerCategory(
        const int bufferIndex,
        const int stateFrequenciesIndex,
        const int scalingFactorsIndex,
        double* outLogLikelihoodPerCategory) {

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

    int u = 0;
    int v = 0;
    for (int l = 0; l < kCategoryCount; l++) {
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += rootPartials[v] * freqs[i];
                v++;
            }
            outLogLikelihoodPerCategory[u] = log(sum);
            u++;
            v += P_PAD;
        }
    }

    if (scalingFactorsIndex >= 0) {
        const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
        int u = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            for (int i = 0; i < kPatternCount; i++) {
                outLogLikelihoodPerCategory[u] += cumulativeScaleFactors[i];
                u++;
            }
        }
    }

    return returnCode;
}